

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerate.cpp
# Opt level: O3

void __thiscall
luna::CodeGenerateVisitor::Visit
          (CodeGenerateVisitor *this,LocalFunctionStatement *l_func_stmt,void *data)

{
  SyntaxTree *pSVar1;
  int register_id;
  ExpVarData_conflict exp_var_data;
  
  register_id = GenerateRegisterId(this);
  InsertName(this,(l_func_stmt->name_).field_0.str_,register_id);
  pSVar1 = (l_func_stmt->func_body_)._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,this);
  return;
}

Assistant:

void CodeGenerateVisitor::Visit(LocalFunctionStatement *l_func_stmt, void *data)
    {
        auto register_id = GenerateRegisterId();
        InsertName(l_func_stmt->name_.str_, register_id);
        ExpVarData exp_var_data{ register_id, register_id + 1 };
        l_func_stmt->func_body_->Accept(this, &exp_var_data);
    }